

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O0

void __thiscall
glslang::TConstUnionArray::TConstUnionArray
          (TConstUnionArray *this,TConstUnionArray *a,int start,int size)

{
  TVector<glslang::TConstUnion> *this_00;
  TConstUnion *pTVar1;
  reference pvVar2;
  int local_24;
  int i;
  int size_local;
  int start_local;
  TConstUnionArray *a_local;
  TConstUnionArray *this_local;
  
  this->_vptr_TConstUnionArray = (_func_int **)&PTR__TConstUnionArray_010d8d80;
  this_00 = (TVector<glslang::TConstUnion> *)
            TVector<glslang::TConstUnion>::operator_new
                      ((TVector<glslang::TConstUnion> *)0x20,(size_t)a);
  TVector<glslang::TConstUnion>::TVector(this_00,(long)size);
  this->unionArray = this_00;
  for (local_24 = 0; local_24 < size; local_24 = local_24 + 1) {
    pTVar1 = operator[](a,(long)(start + local_24));
    pvVar2 = std::vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>::
             operator[](&this->unionArray->
                         super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        ,(long)local_24);
    pvVar2->field_0 = pTVar1->field_0;
    pvVar2->type = pTVar1->type;
  }
  return;
}

Assistant:

TConstUnionArray(const TConstUnionArray& a, int start, int size)
    {
        unionArray = new TConstUnionVector(size);
        for (int i = 0; i < size; ++i)
            (*unionArray)[i] = a[start + i];
    }